

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockArgumentHandler.hpp
# Opt level: O2

size_t __thiscall
ut11::detail::MockArgumentHandler<TestEvent<1>>::CountCalls<TestEvent<1>>
          (MockArgumentHandler<TestEvent<1>_> *this,TestEvent<1> expectations)

{
  size_t sVar1;
  _List_node_base *p_Var2;
  
  sVar1 = 0;
  p_Var2 = (_List_node_base *)this;
  while (p_Var2 = (((list<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_> *)
                   &p_Var2->_M_next)->
                  super__List_base<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this
        ) {
    sVar1 = sVar1 + (*(int *)(p_Var2 + 1) == expectations.value);
  }
  return sVar1;
}

Assistant:

std::size_t CountCalls(Expectations... expectations) const
			{
				static_assert(sizeof...(Expectations) == sizeof...(ARGS), "Expectations and Arguments must match");

				std::size_t counter = 0;

				std::tuple<Expectations...> expectationTuple(expectations...);
				for(const std::tuple<ARGS...>& actual : m_arguments)
				{
					if ( MatchTuples<0, sizeof...(ARGS)>(actual, expectationTuple) )
						++counter;
				}
				return counter;
			}